

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  R_matrix *this_00;
  U_matrix *this_01;
  node_ptr plVar1;
  ulong uVar2;
  Index columnIndex;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
  *this_02;
  _Hash_node_base *p_Var3;
  Column *targetColumn;
  Column *source;
  Column *this_03;
  Column *pCVar4;
  __node_base_ptr p_Var5;
  mapped_type *pmVar6;
  ulong uVar7;
  Index columnIndex_00;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  Column_support *pCVar10;
  bool bVar11;
  ID_index pivot;
  uint local_5c;
  Index local_58;
  anon_class_1_0_00000001 local_54;
  anon_class_1_0_00000001 local_53;
  anon_class_1_0_00000001 local_52;
  anon_class_1_0_00000001 local_51;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
  *local_50;
  Index local_44;
  Column *local_40;
  anon_class_8_1_e4bd5e45 local_38;
  
  this_00 = &this->reducedMatrixR_;
  local_58 = target;
  local_50 = this;
  local_44 = eventIndex;
  local_40 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
             ::get_column(this_00,target);
  plVar1 = (local_40->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  pCVar10 = &local_40->column_;
  columnIndex_00 = 0xffffffff;
  local_5c = 0xffffffff;
  if (plVar1 != (node_ptr)pCVar10 && plVar1 != (node_ptr)0x0) {
    local_5c = *(uint *)&(local_40->column_).super_type.data_.root_plus_size_.m_header.super_node.
                         prev_[1].next_;
  }
  if (local_5c != 0xffffffff) {
    uVar2 = (local_50->pivotToColumnIndex_)._M_h._M_bucket_count;
    uVar7 = (ulong)local_5c % uVar2;
    p_Var8 = (local_50->pivotToColumnIndex_)._M_h._M_buckets[uVar7];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var8->_M_nxt, p_Var5 = p_Var8, *(uint *)&p_Var8->_M_nxt[1]._M_nxt != local_5c)) {
      while (p_Var8 = p_Var3, p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar7) ||
           (p_Var5 = p_Var8, *(uint *)&p_Var3[1]._M_nxt == local_5c)) goto LAB_0014124e;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_0014124e:
    if (p_Var5 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var5->_M_nxt;
    }
    if (p_Var3 != (_Hash_node_base *)0x0) {
      columnIndex_00 = *(Index *)((long)&p_Var3[1]._M_nxt + 4);
    }
  }
  bVar11 = local_5c == 0xffffffff;
  if ((!bVar11) && (columnIndex_00 != 0xffffffff)) {
    this_01 = &local_50->mirrorMatrixU_;
    do {
      columnIndex = local_58;
      targetColumn = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
                     ::get_column(this_00,local_58);
      source = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
               ::get_column(this_00,columnIndex_00);
      local_38.targetColumn = targetColumn;
      _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,true,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,true,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_mat___e_matrix::Column_types)7,false,true,false,true,true,false,true>>::Matrix_column_tag,1u>,false>___1_>
                (source,targetColumn,&local_51,&local_38,&local_52,&local_53,&local_54);
      this_03 = Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
                ::get_column(this_01,columnIndex_00);
      pCVar4 = Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
               ::get_column(this_01,columnIndex);
      Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
      ::push_back(this_03,(Entry *)((long)((pCVar4->column_).super_type.data_.root_plus_size_.
                                           m_header.super_node.next_ + 0xffffffffffffffff) + 8));
      plVar1 = (pCVar10->super_type).data_.root_plus_size_.m_header.super_node.next_;
      columnIndex_00 = 0xffffffff;
      local_5c = 0xffffffff;
      if (plVar1 != (node_ptr)pCVar10 && plVar1 != (node_ptr)0x0) {
        local_5c = *(uint *)&(local_40->column_).super_type.data_.root_plus_size_.m_header.
                             super_node.prev_[1].next_;
      }
      if (local_5c != 0xffffffff) {
        uVar2 = (local_50->pivotToColumnIndex_)._M_h._M_bucket_count;
        uVar7 = (ulong)local_5c % uVar2;
        p_Var8 = (local_50->pivotToColumnIndex_)._M_h._M_buckets[uVar7];
        p_Var5 = (__node_base_ptr)0x0;
        if ((p_Var8 != (__node_base_ptr)0x0) &&
           (p_Var5 = p_Var8, p_Var9 = p_Var8->_M_nxt, *(uint *)&p_Var8->_M_nxt[1]._M_nxt != local_5c
           )) {
          while (p_Var3 = p_Var9->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
            p_Var5 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar7) ||
               (p_Var5 = p_Var9, p_Var9 = p_Var3, *(uint *)&p_Var3[1]._M_nxt == local_5c))
            goto LAB_00141389;
          }
          p_Var5 = (__node_base_ptr)0x0;
        }
LAB_00141389:
        if (p_Var5 == (__node_base_ptr)0x0) {
          p_Var3 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var3 = p_Var5->_M_nxt;
        }
        if (p_Var3 != (_Hash_node_base *)0x0) {
          columnIndex_00 = *(Index *)((long)&p_Var3[1]._M_nxt + 4);
        }
      }
      bVar11 = local_5c == 0xffffffff;
    } while ((!bVar11) && (columnIndex_00 != 0xffffffff));
  }
  this_02 = local_50;
  if (bVar11) {
    local_38.targetColumn._0_4_ = local_58;
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&(local_50->reducedMatrixR_).matrix_,(key_type *)&local_38);
    RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
    ::_add_bar((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
                *)this_02,(pmVar6->super_Column_dimension_option).dim_,local_44);
  }
  else {
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::try_emplace<unsigned_int_const&,unsigned_int&>
              ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&local_50->pivotToColumnIndex_,(const_iterator)0x0,&local_5c,&local_58);
    RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
    ::_update_barcode((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
                       *)this_02,local_5c,local_44);
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}